

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t add_pattern_wcs(archive_match *a,match_list *list,wchar_t *pattern)

{
  match *m;
  size_t sVar1;
  size_t len;
  wchar_t wVar2;
  
  m = (match *)calloc(1,0x78);
  if (m == (match *)0x0) {
    error_nomem(a);
    wVar2 = L'\xffffffe2';
  }
  else {
    sVar1 = wcslen(pattern);
    wVar2 = L'\0';
    if (sVar1 == 0) {
      len = 0;
    }
    else {
      len = sVar1 - (pattern[sVar1 - 1] == L'/');
    }
    archive_mstring_copy_wcs_len(&m->pattern,pattern,len);
    match_list_add(list,m);
    *(byte *)&a->setflag = (byte)a->setflag | 1;
  }
  return wVar2;
}

Assistant:

static int
add_pattern_wcs(struct archive_match *a, struct match_list *list,
    const wchar_t *pattern)
{
	struct match *match;
	size_t len;

	match = calloc(1, sizeof(*match));
	if (match == NULL)
		return (error_nomem(a));
	/* Both "foo/" and "foo" should match "foo/bar". */
	len = wcslen(pattern);
	if (len && pattern[len - 1] == L'/')
		--len;
	archive_mstring_copy_wcs_len(&(match->pattern), pattern, len);
	match_list_add(list, match);
	a->setflag |= PATTERN_IS_SET;
	return (ARCHIVE_OK);
}